

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O2

int get_coeff_cost_eob(int ci,tran_low_t abs_qc,int sign,int coeff_ctx,int dc_sign_ctx,
                      LV_MAP_COEFF_COST *txb_costs,int bhl,TX_CLASS tx_class)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 3;
  if (abs_qc < 3) {
    iVar3 = abs_qc;
  }
  iVar3 = txb_costs->base_eob_cost[(ulong)(uint)coeff_ctx - 1][(long)iVar3 + 2];
  if (abs_qc != 0) {
    iVar1 = 0x200;
    if (ci == 0) {
      iVar1 = txb_costs->dc_sign_cost[dc_sign_ctx][(uint)sign];
    }
    iVar3 = iVar3 + iVar1;
    if (2 < abs_qc) {
      iVar4 = ci >> ((byte)bhl & 0x1f);
      iVar1 = iVar4 << ((byte)bhl & 0x1f);
      if (ci == 0) {
        lVar2 = 0;
      }
      else {
        lVar2 = 7;
        if (((1 < iVar4 || 1 < ci - iVar1) || tx_class != '\0') &&
           (tx_class != '\x01' || iVar4 != 0)) {
          if (ci != iVar1) {
            lVar2 = 0xe;
          }
          if (tx_class != '\x02') {
            lVar2 = 0xe;
          }
        }
      }
      iVar1 = get_br_cost(abs_qc,txb_costs->lps_cost[lVar2]);
      iVar3 = iVar3 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

static inline int get_coeff_cost_eob(int ci, tran_low_t abs_qc, int sign,
                                     int coeff_ctx, int dc_sign_ctx,
                                     const LV_MAP_COEFF_COST *txb_costs,
                                     int bhl, TX_CLASS tx_class) {
  int cost = 0;
  cost += txb_costs->base_eob_cost[coeff_ctx][AOMMIN(abs_qc, 3) - 1];
  if (abs_qc != 0) {
    if (ci == 0) {
      cost += txb_costs->dc_sign_cost[dc_sign_ctx][sign];
    } else {
      cost += av1_cost_literal(1);
    }
    if (abs_qc > NUM_BASE_LEVELS) {
      int br_ctx;
      br_ctx = get_br_ctx_eob(ci, bhl, tx_class);
      cost += get_br_cost(abs_qc, txb_costs->lps_cost[br_ctx]);
    }
  }
  return cost;
}